

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

void pulse_prog_mudschool_snake(ROOM_INDEX_DATA *room)

{
  bool bVar1;
  int iVar2;
  ROOM_INDEX_DATA *in_RDI;
  AFFECT_DATA paf;
  ROOM_AFFECT_DATA af;
  CHAR_DATA *snake;
  CHAR_DATA *ch;
  CHAR_DATA *local_10;
  
  if (((in_RDI->people != (CHAR_DATA *)0x0) &&
      (bVar1 = is_affected_room(in_RDI,(int)gsn_bash), !bVar1)) &&
     (iVar2 = number_percent(), iVar2 < 0x5b)) {
    for (local_10 = in_RDI->people; local_10 != (CHAR_DATA *)0x0; local_10 = local_10->next_in_room)
    {
      is_affected(local_10,(int)gsn_trip);
    }
  }
  return;
}

Assistant:

void pulse_prog_mudschool_snake(ROOM_INDEX_DATA *room)
{
	CHAR_DATA *ch, *snake;
	ROOM_AFFECT_DATA af;
	AFFECT_DATA paf;

	if (!room->people)
		return;

	if (is_affected_room(room, gsn_bash))
		return;

	if (number_percent() > 90)
		return;

	for (ch = room->people; ch != nullptr; ch = ch->next_in_room)
	{
		if (is_affected(ch, gsn_trip))
			continue;
	}

	if (ch == nullptr)
		return;

	snake = create_mobile(get_mob_index(24546));
	char_to_room(snake, room);
	act("Sensing warmth and moisture, a rootsnake bursts from a nearby root and attacks you!", ch, 0, 0, TO_CHAR);
	act("Sensing warmth and moisture, a rootsnake bursts from a nearby root and attacks $n!", ch, 0, 0, TO_ROOM);

	do_murder(snake, ch->name);

	init_affect_room(&af);
	af.where = TO_ROOM_AFFECTS;
	af.type = gsn_bash;
	af.aftype = AFT_SKILL;
	af.duration = 3;
	af.modifier = 0;
	af.location = 0;
	new_affect_to_room(room, &af);

	init_affect(&paf);
	paf.where = TO_AFFECTS;
	paf.type = gsn_trip;
	paf.aftype = AFT_INVIS;
	paf.duration = 4;
	affect_to_char(ch, &paf);
}